

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  iVar6 = (int)outb;
  iVar7 = (int)in;
  if (in == (uchar *)0x0) {
    if (1 < *outlen) {
      outb[0] = 0xff;
      outb[1] = 0xfe;
      *outlen = 2;
      *inlen = 0;
      return 2;
    }
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar7 = 0;
      iVar1 = 0;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        pbVar9 = outb + ((long)*outlen & 0xfffffffffffffffe);
        do {
          bVar4 = *in;
          if ((char)bVar4 < '\0') {
            if (bVar4 < 0xe0) {
              if (bVar4 < 0xc2) {
                iVar1 = -2;
                goto LAB_0012dc63;
              }
              uVar12 = bVar4 & 0x1f;
              uVar10 = 0x80;
              lVar11 = 2;
            }
            else {
              lVar11 = 4 - (ulong)(bVar4 < 0xf0);
              uVar10 = 0x10000;
              if (bVar4 < 0xf0) {
                uVar10 = 0x800;
              }
              uVar12 = bVar4 & 0xf;
            }
            if (lVar11 <= (long)pbVar8 - (long)in) {
              lVar2 = 1;
              do {
                uVar13 = uVar12;
                iVar1 = -2;
                if ((in[lVar2] & 0xc0) != 0x80) goto LAB_0012dc63;
                uVar5 = uVar13 << 6;
                uVar12 = in[lVar2] & 0x3f | uVar5;
                lVar2 = lVar2 + 1;
              } while (lVar11 != lVar2);
              if (((uVar10 <= uVar12) && (uVar5 < 0x110000)) && ((uVar13 & 0x3ffffe0) != 0x360)) {
                bVar4 = (byte)(uVar5 >> 8);
                if (uVar5 < 0x10000) {
                  if (outb < pbVar9) {
                    *outb = (byte)uVar12;
                    lVar2 = 2;
                    lVar3 = 1;
LAB_0012dc4b:
                    outb[lVar3] = bVar4;
                    outb = outb + lVar2;
                    in = in + lVar11;
                    goto LAB_0012dc55;
                  }
                }
                else if (3 < (long)pbVar9 - (long)outb) {
                  *outb = (byte)(uVar12 - 0x10000 >> 10);
                  outb[1] = (byte)(uVar12 - 0x10000 >> 0x12) | 0xd8;
                  outb[2] = (byte)uVar12;
                  bVar4 = bVar4 & 3 | 0xdc;
                  lVar2 = 4;
                  lVar3 = 3;
                  goto LAB_0012dc4b;
                }
LAB_0012dc87:
                iVar1 = -3;
              }
              goto LAB_0012dc63;
            }
            break;
          }
          if (pbVar9 <= outb) goto LAB_0012dc87;
          *outb = bVar4;
          outb[1] = 0;
          in = in + 1;
          outb = outb + 2;
LAB_0012dc55:
        } while (in < pbVar8);
      }
      iVar1 = (int)outb - iVar6;
LAB_0012dc63:
      *outlen = (int)outb - iVar6;
      iVar7 = (int)in - iVar7;
    }
    *inlen = iVar7;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen,
            void *vctxt ATTRIBUTE_UNUSED) {
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen, NULL));
}